

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sanity.cpp
# Opt level: O2

void __thiscall
cubeb_init_destroy_multiple_contexts_Test::TestBody(cubeb_init_destroy_multiple_contexts_Test *this)

{
  int line;
  AssertionResult *pAVar1;
  AssertionResult *ctx_00;
  long lVar2;
  cubeb_ops *message;
  char *message_00;
  AssertHelper local_80;
  AssertionResult gtest_ar_1;
  int r;
  AssertHelper local_60;
  cubeb *ctx [4];
  
  pAVar1 = &gtest_ar_1;
  gtest_ar_1.success_ = true;
  gtest_ar_1._1_7_ = 0;
  local_80.data_ = (AssertHelperData *)0x4;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)ctx,"ARRAY_LENGTH(ctx)","ARRAY_LENGTH(order)",(unsigned_long *)pAVar1,
             (unsigned_long *)&local_80);
  if ((char)ctx[0] == '\0') {
    testing::Message::Message((Message *)&gtest_ar_1);
    pAVar1 = (AssertionResult *)ctx;
    if (ctx[1] == (cubeb *)0x0) {
      message = (cubeb_ops *)0x12ad72;
    }
    else {
      message = ctx[1]->ops;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
               ,0x65,(char *)message);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
LAB_0010891d:
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&pAVar1->message_);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)(ctx + 1));
    for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 8) {
      ctx_00 = (AssertionResult *)((long)ctx + lVar2);
      r = common_init((cubeb **)ctx_00,(char *)0x0);
      local_80.data_ = local_80.data_ & 0xffffffff00000000;
      testing::internal::EqHelper<false>::Compare<int,__0>
                (&gtest_ar_1.success_,(char *)&r,(int *)&local_80,(anon_enum_32 *)pAVar1);
      if (gtest_ar_1.success_ == false) {
        testing::Message::Message((Message *)&local_80);
        if (gtest_ar_1.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message_00 = "";
        }
        else {
          message_00 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
        }
        line = 0x69;
LAB_001088ef:
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
                   ,line,message_00);
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_80);
        testing::internal::AssertHelper::~AssertHelper(&local_60);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_80);
        pAVar1 = &gtest_ar_1;
        goto LAB_0010891d;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_1.message_);
      local_80.data_ = (AssertHelperData *)0x0;
      testing::internal::CmpHelperNE<cubeb*,decltype(nullptr)>
                ((internal *)&gtest_ar_1,"ctx[i]","nullptr",(cubeb **)ctx_00,&local_80.data_);
      if (gtest_ar_1.success_ == false) {
        testing::Message::Message((Message *)&local_80);
        if (gtest_ar_1.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message_00 = "";
        }
        else {
          message_00 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
        }
        line = 0x6a;
        goto LAB_001088ef;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_1.message_);
      pAVar1 = ctx_00;
    }
    for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 4) {
      cubeb_destroy(ctx[*(int *)((long)&DAT_00127040 + lVar2)]);
    }
  }
  return;
}

Assistant:

TEST(cubeb, init_destroy_multiple_contexts)
{
  size_t i;
  int r;
  cubeb * ctx[4];
  int order[4] = {2, 0, 3, 1};
  ASSERT_EQ(ARRAY_LENGTH(ctx), ARRAY_LENGTH(order));

  for (i = 0; i < ARRAY_LENGTH(ctx); ++i) {
    r = common_init(&ctx[i], NULL);
    ASSERT_EQ(r, CUBEB_OK);
    ASSERT_NE(ctx[i], nullptr);
  }

  /* destroy in a different order */
  for (i = 0; i < ARRAY_LENGTH(ctx); ++i) {
    cubeb_destroy(ctx[order[i]]);
  }
}